

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O0

void dump_symbol_name(TextBuffer *buf,LuaSymbol *sym)

{
  LuaSymbol *sym_local;
  TextBuffer *buf_local;
  
  switch(sym->symbol_type) {
  case SYM_LOCAL:
    printf_buf(buf,"SymLocalRef { name=\'%t\', symbol_id = %P }",(sym->field_1).variable.var_name,
               sym);
    break;
  case SYM_UPVALUE:
    if (((sym->field_1).variable.var_name)->len == 4) {
      printf_buf(buf,"SymUpvalRef { name=\'%t\', symbol_id = %P, env = true }",
                 *(undefined8 *)((long)&((sym->field_1).label.pseudo)->field_3 + 0x10),
                 (sym->field_1).variable.var_name);
    }
    else {
      printf_buf(buf,"SymUpvalRef { name=\'%t\', symbol_id = %P }",
                 *(undefined8 *)((long)&((sym->field_1).label.pseudo)->field_3 + 0x10),
                 (sym->field_1).variable.var_name);
    }
    break;
  case SYM_GLOBAL:
    printf_buf(buf,"SymGlobalRef { name=\'%t\', symbol_id = %P }",(sym->field_1).variable.var_name,
               sym);
    break;
  case SYM_LABEL:
    printf_buf(buf,"SymLabelRef { name=\'%t\', symbol_id = %P }",(sym->field_1).label.label_name,sym
              );
    break;
  case SYM_ENV:
    printf_buf(buf,"SymEnvRef { name=\'%t\', symbol_id = %P }",(sym->field_1).variable.var_name,sym)
    ;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_printer_n.c"
                  ,0xd8,"void dump_symbol_name(TextBuffer *, LuaSymbol *)");
  }
  return;
}

Assistant:

static void dump_symbol_name(TextBuffer *buf, LuaSymbol *sym)
{
	switch (sym->symbol_type) {
	case SYM_LOCAL: {
		printf_buf(buf, "SymLocalRef { name='%t', symbol_id = %P }", sym->variable.var_name, sym);
		break;
	}
	case SYM_ENV: {
		printf_buf(buf, "SymEnvRef { name='%t', symbol_id = %P }", sym->variable.var_name, sym);
		break;
	}
	case SYM_GLOBAL: {
		printf_buf(buf, "SymGlobalRef { name='%t', symbol_id = %P }", sym->variable.var_name, sym);
		break;
	}
	case SYM_UPVALUE: {
		if (sym->upvalue.target_variable->symbol_type == SYM_ENV) {
			printf_buf(buf, "SymUpvalRef { name='%t', symbol_id = %P, env = true }",
				   sym->upvalue.target_variable->variable.var_name, sym->upvalue.target_variable);
		} else {
			printf_buf(buf, "SymUpvalRef { name='%t', symbol_id = %P }",
				   sym->upvalue.target_variable->variable.var_name, sym->upvalue.target_variable);
		}
		break;
	}
	case SYM_LABEL: {
		printf_buf(buf, "SymLabelRef { name='%t', symbol_id = %P }", sym->label.label_name, sym);
		break;
	}
	default:
		assert(0);
	}
}